

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

int netaddr_create_host_bin(netaddr *host,netaddr *netmask,void *number,size_t num_length)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint8_t *number_byte;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  byte bVar12;
  
  uVar5 = *(undefined8 *)(netmask->_addr + 8);
  *(undefined8 *)host->_addr = *(undefined8 *)netmask->_addr;
  *(undefined8 *)(host->_addr + 8) = uVar5;
  uVar3 = netmask->_type;
  uVar4 = netmask->_prefix_len;
  host->_type = uVar3;
  host->_prefix_len = uVar4;
  if ((byte)uVar3 < 0x2f) {
    if (uVar3 == 2) {
      bVar12 = 0x20;
    }
    else {
      if (uVar3 != 10) {
LAB_001460d8:
        bVar6 = true;
        bVar12 = 0;
        goto LAB_001460e9;
      }
      bVar12 = 0x80;
    }
  }
  else if (uVar3 == 0x2f) {
    bVar12 = 0x30;
  }
  else {
    if (uVar3 != 0x30) goto LAB_001460d8;
    bVar12 = 0x40;
  }
  bVar6 = false;
LAB_001460e9:
  host->_prefix_len = bVar12;
  iVar7 = -1;
  if (!bVar6) {
    bVar2 = netmask->_prefix_len;
    iVar7 = 0;
    if (num_length != 0 && bVar12 != bVar2) {
      uVar9 = (bVar12 | 7) - (uint)bVar2;
      uVar11 = uVar9 + 7;
      if (-1 < (int)uVar9) {
        uVar11 = uVar9;
      }
      uVar8 = (ulong)(uVar11 >> 3 & 0xff);
      lVar10 = num_length - uVar8;
      if (num_length < uVar8) {
        uVar8 = (bVar12 >> 3) - num_length;
        lVar10 = 0;
      }
      else {
        uVar8 = (ulong)(bVar2 >> 3);
        if ((bVar2 & 7) != 0) {
          bVar12 = (byte)(-0x100 >> (bVar2 & 7)) & host->_addr[uVar8];
          host->_addr[uVar8] = bVar12;
          pbVar1 = (byte *)((long)number + lVar10);
          lVar10 = lVar10 + 1;
          host->_addr[uVar8] = (byte)(0xff >> (bVar2 & 7)) & *pbVar1 | bVar12;
          uVar8 = uVar8 + 1;
        }
      }
      memcpy(host->_addr + uVar8,(void *)((long)number + lVar10),num_length - lVar10);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int
netaddr_create_host_bin(struct netaddr *host, const struct netaddr *netmask, const void *number, size_t num_length) {
  size_t host_index, number_index;
  uint8_t host_part_length;
  const uint8_t *number_byte;
  uint8_t mask;

  number_byte = number;

  /* copy netmask with prefixlength max */
  memcpy(host, netmask, sizeof(*netmask));
  host->_prefix_len = netaddr_get_maxprefix(host);

  /* unknown address type */
  if (host->_prefix_len == 0) {
    return -1;
  }

  /* netmask has no host part */
  if (host->_prefix_len == netmask->_prefix_len || num_length == 0) {
    return 0;
  }

  /* calculate starting byte in host and number */
  host_part_length = (host->_prefix_len - netmask->_prefix_len + 7) / 8;
  if (host_part_length > num_length) {
    host_index = host->_prefix_len / 8 - num_length;
    number_index = 0;
  }
  else {
    host_index = netmask->_prefix_len / 8;
    number_index = num_length - host_part_length;

    /* copy bit masked part */
    if ((netmask->_prefix_len & 7) != 0) {
      mask = (255 >> (netmask->_prefix_len & 7));
      host->_addr[host_index] &= (~mask);
      host->_addr[host_index] |= (number_byte[number_index++]) & mask;
      host_index++;
    }
  }

  /* copy bytes */
  memcpy(&host->_addr[host_index], &number_byte[number_index], num_length - number_index);
  return 0;
}